

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O1

FiniteAutomaton *
Omega_h::FiniteAutomaton::simplify_once(FiniteAutomaton *__return_storage_ptr__,FiniteAutomaton *fa)

{
  ulong *puVar1;
  int iVar2;
  const_iterator cVar3;
  mapped_type *pmVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  size_type __n;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_int>_>,_bool> pVar9;
  int next_state;
  FiniteAutomaton *out;
  vector<bool,_std::allocator<bool>_> did_simple;
  uint local_a0;
  int local_9c;
  FiniteAutomaton *local_98;
  vector<bool,_std::allocator<bool>_> local_90;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
  local_68;
  
  local_68._M_impl.super__Rb_tree_key_compare<Omega_h::StateRowLess>._M_key_compare.accepted =
       &fa->accepted_tokens;
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  lVar6 = 0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  __n = 0;
  local_98 = __return_storage_ptr__;
  local_68._M_impl.super__Rb_tree_key_compare<Omega_h::StateRowLess>._M_key_compare.table =
       &fa->table;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    iVar2 = get_nrows<int>(&fa->table);
    uVar5 = (uint)__n;
    if (iVar2 <= lVar6) break;
    local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)((__n << 0x20) + lVar6);
    pVar9 = std::
            _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,Omega_h::StateRowLess,std::allocator<std::pair<int_const,int>>>
            ::_M_emplace_unique<std::pair<int,int>>
                      ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,Omega_h::StateRowLess,std::allocator<std::pair<int_const,int>>>
                        *)&local_68,(pair<int,_int> *)&local_90);
    __n = (size_type)(uVar5 + (pVar9.second & 1));
    lVar6 = lVar6 + 1;
  }
  FiniteAutomaton(local_98,(fa->table).ncols + (uint)fa->is_deterministic * 2 + -2,
                  fa->is_deterministic,uVar5);
  uVar7 = __n;
  while (uVar5 != 0) {
    add_state(local_98);
    uVar5 = (int)uVar7 - 1;
    uVar7 = (ulong)uVar5;
  }
  local_a0 = local_a0 & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_90,__n,(bool *)&local_a0,(allocator_type *)&local_9c);
  uVar5 = 0;
  while( true ) {
    local_a0 = uVar5;
    iVar2 = get_nrows<int>(&fa->table);
    if (iVar2 <= (int)uVar5) {
      if ((pair<int,_int>)
          local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (pair<int,_int>)0x0) {
        operator_delete(local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_68);
      return local_98;
    }
    cVar3 = std::
            _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
            ::find(&local_68,(key_type *)&local_a0);
    if ((_Rb_tree_header *)cVar3._M_node == &local_68._M_impl.super__Rb_tree_header) break;
    pmVar4 = std::map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[]((map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&local_68,(key_type *)&local_a0);
    iVar2 = *pmVar4;
    uVar7 = (ulong)iVar2;
    if ((long)uVar7 < 0) {
      fail("assertion %s failed at %s +%d\n","0 <= i",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_std_vector.hpp"
           ,0x13);
    }
    if ((*(ulong *)((long)local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                   (uVar7 >> 6) * 8) >> (uVar7 & 0x3f) & 1) == 0) {
      if (0 < (fa->table).ncols) {
        iVar8 = 0;
        do {
          local_9c = step(fa,local_a0,iVar8);
          if (local_9c != -1) {
            cVar3 = std::
                    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                    ::find(&local_68,&local_9c);
            if ((_Rb_tree_header *)cVar3._M_node == &local_68._M_impl.super__Rb_tree_header) {
              fail("assertion %s failed at %s +%d\n","sr2ss.count(next_state)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
                   ,0x164);
            }
            pmVar4 = std::
                     map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_Omega_h::StateRowLess,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)&local_68,&local_9c);
            add_transition(local_98,iVar2,iVar8,*pmVar4);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < (fa->table).ncols);
      }
      iVar8 = accepts(fa,local_a0);
      if (iVar8 != -1) {
        add_accept(local_98,iVar2,iVar8);
      }
      puVar1 = (ulong *)((long)local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                        (uVar7 >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)iVar2 & 0x3f);
    }
    uVar5 = local_a0 + 1;
  }
  fail("assertion %s failed at %s +%d\n","sr2ss.count(state)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
       ,0x15e);
}

Assistant:

FiniteAutomaton FiniteAutomaton::simplify_once(FiniteAutomaton const& fa) {
  StateRow2SimpleState sr2ss({fa.table, fa.accepted_tokens});
  int nsimple = 0;
  for (int state = 0; state < get_nstates(fa); ++state) {
    auto res = sr2ss.insert(std::make_pair(state, nsimple));
    if (res.second) {
      ++nsimple;
    }
  }
  FiniteAutomaton out(get_nsymbols(fa), get_determinism(fa), nsimple);
  for (int simple = 0; simple < nsimple; ++simple) {
    add_state(out);
  }
  std::vector<bool> did_simple(size_t(nsimple), false);
  for (int state = 0; state < get_nstates(fa); ++state) {
    OMEGA_H_CHECK(sr2ss.count(state));
    auto simple = sr2ss[state];
    if (at(did_simple, simple)) continue;
    for (int symbol = 0; symbol < get_nsymbols_eps(fa); ++symbol) {
      auto next_state = step(fa, state, symbol);
      if (next_state == -1) continue;
      OMEGA_H_CHECK(sr2ss.count(next_state));
      auto next_simple = sr2ss[next_state];
      add_transition(out, simple, symbol, next_simple);
    }
    auto token = accepts(fa, state);
    if (token != -1) {
      add_accept(out, simple, token);
    }
    at(did_simple, simple) = true;
  }
  return out;
}